

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void list(string *rootDir)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 local_70 [8];
  string fileSize;
  Image *image;
  iterator __end1;
  iterator __begin1;
  vector<Image,_std::allocator<Image>_> *__range1;
  int count;
  string *rootDir_local;
  
  printf("%4s  %20s  %10s  %30s\n","#","Image ID","Size","Last Modified");
  __range1._4_4_ = 0;
  getContainerImages((vector<Image,_std::allocator<Image>_> *)&__begin1,rootDir);
  __end1 = std::vector<Image,_std::allocator<Image>_>::begin
                     ((vector<Image,_std::allocator<Image>_> *)&__begin1);
  image = (Image *)std::vector<Image,_std::allocator<Image>_>::end
                             ((vector<Image,_std::allocator<Image>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>
                                *)&image);
    if (!bVar1) break;
    fileSize.field_2._8_8_ =
         __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::
         operator*(&__end1);
    getHumanReadableFileSize_abi_cxx11_
              ((string *)local_70,((reference)fileSize.field_2._8_8_)->fileSize);
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    printf("%4d  %20s  %10s  %30s\n",(ulong)__range1._4_4_,uVar2,uVar3,uVar4);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::__cxx11::string::~string((string *)local_70);
    __gnu_cxx::__normal_iterator<Image_*,_std::vector<Image,_std::allocator<Image>_>_>::operator++
              (&__end1);
  }
  std::vector<Image,_std::allocator<Image>_>::~vector
            ((vector<Image,_std::allocator<Image>_> *)&__begin1);
  return;
}

Assistant:

void list(const std::string& rootDir)
{
    printf("%4s  %20s  %10s  %30s\n", "#", "Image ID", "Size", "Last Modified");
    int count = 0;
    for (const auto& image : getContainerImages(rootDir))
    {
        std::string fileSize = getHumanReadableFileSize(image.fileSize);
        printf("%4d  %20s  %10s  %30s\n", count, image.id.c_str(), fileSize.c_str(), image.lastModified.c_str());
        count++;
    }
}